

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscStatements.cpp
# Opt level: O3

bool slang::ast::isValidAssignLVal(Expression *expr)

{
  Type *pTVar1;
  long lVar2;
  byte bVar3;
  Symbol *pSVar4;
  uint uVar5;
  long lVar6;
  bool bVar7;
  
  if (expr->kind - NamedValue < 2) {
    pSVar4 = Expression::getSymbolReference(expr,true);
    if (pSVar4 == (Symbol *)0x0) {
LAB_004ea0c8:
      bVar3 = 1;
      goto LAB_004ea0ca;
    }
    uVar5 = pSVar4->kind - Variable;
    if (uVar5 < 0x19) {
      bVar3 = (byte)(0x1800c0f >> ((byte)uVar5 & 0x1f));
      goto LAB_004ea0ca;
    }
  }
  else if (expr->kind == Concatenation) {
    pTVar1 = expr[1].type.ptr;
    if (pTVar1 != (Type *)0x0) {
      lVar2 = *(long *)(expr + 1);
      lVar6 = 0;
      do {
        bVar3 = isValidAssignLVal(*(Expression **)(lVar2 + lVar6));
        if (!(bool)bVar3) break;
        bVar7 = (long)pTVar1 * 8 + -8 != lVar6;
        lVar6 = lVar6 + 8;
      } while (bVar7);
      goto LAB_004ea0ca;
    }
    goto LAB_004ea0c8;
  }
  bVar3 = 0;
LAB_004ea0ca:
  return (bool)(bVar3 & 1);
}

Assistant:

static bool isValidAssignLVal(const Expression& expr) {
    switch (expr.kind) {
        case ExpressionKind::NamedValue:
        case ExpressionKind::HierarchicalValue:
            if (auto sym = expr.getSymbolReference()) {
                if (!VariableSymbol::isKind(sym->kind))
                    return false;
            }
            return true;
        case ExpressionKind::Concatenation:
            for (auto op : expr.as<ConcatenationExpression>().operands()) {
                if (!isValidAssignLVal(*op))
                    return false;
            }
            return true;
        default:
            return false;
    }
}